

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall doctest::anon_unknown_14::XmlWriter::endElement(XmlWriter *this)

{
  ostream *poVar1;
  reference pvVar2;
  XmlWriter *in_RDI;
  XmlWriter *in_stack_ffffffffffffffc0;
  string local_28 [40];
  
  newlineIfNecessary(in_stack_ffffffffffffffc0);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_28,(ulong)&in_RDI->m_indent);
  std::__cxx11::string::operator=((string *)&in_RDI->m_indent,local_28);
  std::__cxx11::string::~string(local_28);
  if ((in_RDI->m_tagIsOpen & 1U) == 0) {
    poVar1 = std::operator<<(in_RDI->m_os,(string *)&in_RDI->m_indent);
    poVar1 = std::operator<<(poVar1,"</");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)poVar1);
    poVar1 = std::operator<<(poVar1,(string *)pvVar2);
    std::operator<<(poVar1,">");
  }
  else {
    std::operator<<(in_RDI->m_os,"/>");
    in_RDI->m_tagIsOpen = false;
  }
  std::ostream::operator<<(in_RDI->m_os,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1182a5);
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::endElement() {
        newlineIfNecessary();
        m_indent = m_indent.substr( 0, m_indent.size()-2 );
        if( m_tagIsOpen ) {
            m_os << "/>";
            m_tagIsOpen = false;
        }
        else {
            m_os << m_indent << "</" << m_tags.back() << ">";
        }
        m_os << std::endl;
        m_tags.pop_back();
        return *this;
    }